

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itree.c
# Opt level: O0

cell_index_t itree_add_child(itree_t *t,cell_index_t parent,cell_id_t id)

{
  cell_t *pcVar1;
  cell_t *cell;
  cell_index_t local_20;
  cell_index_t new;
  cell_index_t child;
  cell_index_t end;
  cell_id_t id_local;
  cell_index_t parent_local;
  itree_t *t_local;
  
  pcVar1 = t->cell;
  child = id;
  end = parent;
  _id_local = t;
  if (pcVar1[parent].child == 0xffffffff) {
    local_20 = itree_new_cell(t);
    pcVar1[end].child = local_20;
    pcVar1[local_20].id = child;
    pcVar1[local_20].sib = 0xffffffff;
    pcVar1[local_20].child = 0xffffffff;
  }
  else {
    local_20 = itree_find(t,&new,pcVar1[parent].child,id);
    if (local_20 == 0xffffffff) {
      local_20 = itree_add_sib(_id_local,new,child);
    }
  }
  return local_20;
}

Assistant:

cell_index_t itree_add_child(itree_t *t,
			     cell_index_t parent,
			     cell_id_t id)
{
    cell_index_t end;
    cell_index_t child;
    cell_index_t new;
    cell_t *cell;

    cell = t->cell;

    if (cell[parent].child == NO_ID) {
	new = itree_new_cell(t);

	cell[parent].child = new;

	cell[new].id = id;
	cell[new].sib = NULL_INDEX;
	cell[new].child = NULL_INDEX;

	child = new;
    }
    else {
	child = itree_find(t, &end, cell[parent].child, id);
	if (child == NULL_INDEX) {
	    child = itree_add_sib(t, end, id);
	}
    }

    return child;
}